

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_dse_ustore(jit_State *J)

{
  IRType1 *pIVar1;
  IRIns *pIVar2;
  ushort uVar3;
  IRRef1 IVar4;
  ushort uVar5;
  AliasRet AVar6;
  TRef TVar7;
  IRIns *pIVar8;
  IRRef1 *pIVar9;
  IRRef1 *pIVar10;
  
  uVar3 = (J->fold).ins.field_0.op1;
  IVar4 = (J->fold).ins.field_0.op2;
  pIVar8 = (J->cur).ir;
  pIVar10 = J->chain + 0x4c;
  while( true ) {
    uVar5 = *pIVar10;
    if (uVar5 <= uVar3) break;
    pIVar2 = pIVar8 + uVar5;
    AVar6 = aa_uref(pIVar8 + uVar3,pIVar8 + (pIVar2->field_0).op1);
    if (AVar6 == ALIAS_MAY) {
      if ((pIVar2->field_0).op2 != IVar4) break;
    }
    else if (AVar6 == ALIAS_MUST) {
      if ((pIVar2->field_0).op2 == IVar4) {
        return 4;
      }
      if (J->chain[0x11] < uVar5) {
        pIVar8 = pIVar8 + ((J->cur).nins - 1);
        goto LAB_00123c48;
      }
      break;
    }
    pIVar10 = &(pIVar2->field_0).prev;
  }
  goto LAB_00123cb9;
  while (pIVar1 = &(pIVar8->field_1).t, pIVar8 = pIVar8 + -1, -1 < (char)pIVar1->irt) {
LAB_00123c48:
    if (pIVar8 <= pIVar2) {
      *pIVar10 = (pIVar2->field_0).prev;
      *pIVar2 = (IRIns)0xc0000000000;
      if (((uVar5 + 1 < (J->cur).nins) && (*(char *)((long)pIVar2 + 0xd) == 'Y')) &&
         (pIVar2[1].field_0.op1 == uVar3)) {
        pIVar8 = (J->cur).ir;
        pIVar10 = J->chain + 0x59;
        do {
          pIVar9 = pIVar10;
          uVar3 = *pIVar9;
          pIVar10 = &(&pIVar8->field_0)[uVar3].prev;
        } while (uVar5 + 1 < (uint)uVar3);
        pIVar8 = pIVar8 + uVar3;
        *pIVar9 = (pIVar8->field_0).prev;
        *pIVar8 = (IRIns)0xc0000000000;
      }
      break;
    }
  }
LAB_00123cb9:
  TVar7 = lj_ir_emit(J);
  return TVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ustore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[IR_USTORE];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads). */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	if (ref+1 < J->cur.nins &&
	    store[1].o == IR_OBAR && store[1].op1 == xref) {
	  IRRef1 *bp = &J->chain[IR_OBAR];
	  IRIns *obar;
	  for (obar = IR(*bp); *bp > ref+1; obar = IR(*bp))
	    bp = &obar->prev;
	  /* Remove OBAR, too. */
	  *bp = obar->prev;
	  lj_ir_nop(obar);
	}
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}